

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 NavCalcPreferredRefPos(void)

{
  float *pfVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImVec2 *pIVar4;
  uint uVar5;
  float fVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  float fVar9;
  float fVar10;
  ImVec2 IVar11;
  float fVar12;
  float fVar13;
  ImVec2 IVar14;
  
  if (((GImGui->NavDisableHighlight != false) || (GImGui->NavDisableMouseHover != true)) ||
     (pIVar3 = GImGui->NavWindow, pIVar3 == (ImGuiWindow *)0x0)) {
    IVar8 = (GImGui->IO).MousePos;
    goto LAB_0016c7a5;
  }
  iVar2 = GImGui->NavLayer;
  fVar6 = (GImGui->Style).FramePadding.x * 4.0;
  fVar13 = pIVar3->NavRectRel[iVar2].Min.x;
  fVar10 = pIVar3->NavRectRel[iVar2].Max.x - fVar13;
  if (fVar10 <= fVar6) {
    fVar6 = fVar10;
  }
  fVar10 = pIVar3->NavRectRel[iVar2].Max.y;
  fVar9 = (GImGui->Style).FramePadding.y;
  fVar12 = fVar10 - pIVar3->NavRectRel[iVar2].Min.y;
  if (fVar12 <= fVar9) {
    fVar9 = fVar12;
  }
  fVar9 = (fVar10 - fVar9) + (pIVar3->Pos).y;
  fVar10 = (GImGui->IO).DisplayVisibleMin.x;
  pIVar4 = &(GImGui->IO).DisplayVisibleMax;
  if ((fVar10 != pIVar4->x) || (NAN(fVar10) || NAN(pIVar4->x))) {
    fVar10 = (GImGui->IO).DisplayVisibleMin.y;
    pfVar1 = &(GImGui->IO).DisplayVisibleMax.y;
    if ((fVar10 == *pfVar1) && (!NAN(fVar10) && !NAN(*pfVar1))) goto LAB_0016c7ad;
    IVar11 = (GImGui->IO).DisplayVisibleMin;
    pIVar4 = &(GImGui->IO).DisplayVisibleMax;
  }
  else {
LAB_0016c7ad:
    pIVar4 = &(GImGui->IO).DisplaySize;
    IVar11.x = 0.0;
    IVar11.y = 0.0;
  }
  fVar6 = fVar6 + fVar13 + (pIVar3->Pos).x;
  IVar14 = *pIVar4;
  fVar13 = IVar11.y;
  if ((IVar11.y <= fVar9) && (fVar13 = IVar14.y, fVar9 <= IVar14.y)) {
    fVar13 = fVar9;
  }
  if (fVar6 <= IVar14.x) {
    IVar14.x = fVar6;
  }
  uVar5 = -(uint)(fVar6 < IVar11.x);
  IVar8.x = (float)(uVar5 & (uint)IVar11.x | ~uVar5 & (uint)IVar14.x);
  IVar8.y = fVar13;
LAB_0016c7a5:
  IVar7.x = (float)(int)IVar8.x;
  IVar7.y = (float)(int)IVar8.y;
  return IVar7;
}

Assistant:

static ImVec2 NavCalcPreferredRefPos()
{
    ImGuiContext& g = *GImGui;
    if (g.NavDisableHighlight || !g.NavDisableMouseHover || !g.NavWindow)
        return ImFloor(g.IO.MousePos);

    // When navigation is active and mouse is disabled, decide on an arbitrary position around the bottom left of the currently navigated item
    const ImRect& rect_rel = g.NavWindow->NavRectRel[g.NavLayer];
    ImVec2 pos = g.NavWindow->Pos + ImVec2(rect_rel.Min.x + ImMin(g.Style.FramePadding.x*4, rect_rel.GetWidth()), rect_rel.Max.y - ImMin(g.Style.FramePadding.y, rect_rel.GetHeight()));
    ImRect visible_rect = GetViewportRect();
    return ImFloor(ImClamp(pos, visible_rect.Min, visible_rect.Max));   // ImFloor() is important because non-integer mouse position application in back-end might be lossy and result in undesirable non-zero delta.
}